

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O0

true_reference __thiscall
boost::numeric::ublas::
compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
::insert_element(compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *this,size_type i,const_reference t)

{
  double *__result;
  iterator puVar1;
  long lVar2;
  double dVar3;
  iterator pdVar4;
  double *in_RDX;
  size_type in_RSI;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RDI;
  iterator itt;
  difference_type n;
  subiterator_type it;
  undefined8 in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  double *__last;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff90;
  double *__first;
  size_type local_38;
  iterator local_30;
  iterator local_28;
  double *local_20;
  double *local_18;
  size_type local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDI->capacity_ <= in_RDI->filled_) {
    reserve(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
            SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
  }
  local_28 = unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (&in_RDI->index_data_);
  local_30 = unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (&in_RDI->index_data_);
  local_30 = local_30 + in_RDI->filled_;
  local_38 = k_based(local_10);
  __result = (double *)
             detail::lower_bound<unsigned_long*,unsigned_long,std::less<unsigned_long>>
                       (&local_28,&local_30,&local_38);
  local_20 = __result;
  puVar1 = unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (&in_RDI->index_data_);
  lVar2 = (long)__result - (long)puVar1 >> 3;
  in_RDI->filled_ = in_RDI->filled_ + 1;
  puVar1 = unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (&in_RDI->index_data_);
  __last = (double *)(puVar1 + lVar2);
  local_20 = __last;
  puVar1 = unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (&in_RDI->index_data_);
  __first = (double *)(puVar1 + (in_RDI->filled_ - 1));
  unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin(&in_RDI->index_data_);
  std::copy_backward<unsigned_long*,unsigned_long*>
            ((unsigned_long *)__first,(unsigned_long *)__last,(unsigned_long *)__result);
  dVar3 = (double)k_based(local_10);
  *local_20 = dVar3;
  pdVar4 = unbounded_array<double,_std::allocator<double>_>::begin(&in_RDI->value_data_);
  unbounded_array<double,_std::allocator<double>_>::begin(&in_RDI->value_data_);
  unbounded_array<double,_std::allocator<double>_>::begin(&in_RDI->value_data_);
  std::copy_backward<double*,double*>(__first,__last,__result);
  pdVar4[lVar2] = *local_18;
  storage_invariants(in_RDI);
  return pdVar4 + lVar2;
}

Assistant:

BOOST_UBLAS_INLINE
        true_reference insert_element (size_type i, const_reference t) {
            BOOST_UBLAS_CHECK (!find_element (i), bad_index ());        // duplicate element
            if (filled_ >= capacity_)
                reserve (2 * capacity_, true);
            subiterator_type it (detail::lower_bound (index_data_.begin (), index_data_.begin () + filled_, k_based (i), std::less<size_type> ()));
            // ISSUE max_capacity limit due to difference_type
            typename std::iterator_traits<subiterator_type>::difference_type n = it - index_data_.begin ();
            BOOST_UBLAS_CHECK (filled_ == 0 || filled_ == typename index_array_type::size_type (n) || *it != k_based (i), internal_logic ());   // duplicate found by lower_bound
            ++ filled_;
            it = index_data_.begin () + n;
            std::copy_backward (it, index_data_.begin () + filled_ - 1, index_data_.begin () + filled_);
            *it = k_based (i);
            typename value_array_type::iterator itt (value_data_.begin () + n);
            std::copy_backward (itt, value_data_.begin () + filled_ - 1, value_data_.begin () + filled_);
            *itt = t;
            storage_invariants ();
            return *itt;
        }